

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

bool __thiscall rest_rpc::rpc_client::wait_conn(rpc_client *this,size_t timeout)

{
  bool bVar1;
  unique_lock<std::mutex> *this_00;
  atomic<bool> *in_RDI;
  bool result;
  unique_lock<std::mutex> lock;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  unique_lock<std::mutex> *in_stack_ffffffffffffffa0;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  condition_variable *in_stack_ffffffffffffffd8;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffe0;
  unsigned_long local_18 [2];
  byte local_1;
  
  bVar1 = std::atomic::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    in_RDI[0x120]._M_base._M_i = true;
    std::unique_lock<std::mutex>::unique_lock
              (in_stack_ffffffffffffffa0,
               (mutex_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    this_00 = (unique_lock<std::mutex> *)(in_RDI + 0xf0);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
              ((duration<long,std::ratio<1l,1l>> *)&stack0xffffffffffffffc8,local_18);
    std::condition_variable::
    wait_for<long,std::ratio<1l,1l>,rest_rpc::rpc_client::wait_conn(unsigned_long)::_lambda()_1_>
              (in_stack_ffffffffffffffd8,
               (unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffe0);
    in_RDI[0x120]._M_base._M_i = false;
    local_1 = std::atomic::operator_cast_to_bool(in_RDI);
    std::unique_lock<std::mutex>::~unique_lock(this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool wait_conn(size_t timeout) {
    if (has_connected_) {
      return true;
    }

    has_wait_ = true;
    std::unique_lock<std::mutex> lock(conn_mtx_);
    bool result = conn_cond_.wait_for(lock, std::chrono::seconds(timeout),
                                      [this] { return has_connected_.load(); });
    has_wait_ = false;
    return has_connected_;
  }